

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O3

_Bool flatview_access_valid
                (uc_struct_conflict15 *uc,FlatView *fv,hwaddr addr,hwaddr len,_Bool is_write,
                MemTxAttrs attrs)

{
  long lVar1;
  _Bool _Var2;
  MemoryRegion_conflict *mr;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  hwaddr l;
  hwaddr xlat;
  hwaddr local_48;
  uc_struct_conflict15 *local_40;
  hwaddr local_38;
  
  if (len != 0) {
    local_40 = uc;
    do {
      local_48 = len;
      mr = flatview_translate_tricore(uc,fv,addr,&local_38,&local_48,is_write,attrs);
      if ((is_write) && (mr->ram != false)) {
        if (mr->readonly != false) {
LAB_00ce97ff:
          uVar3 = (mr->ops->valid).max_access_size;
          if (uVar3 == 0) {
            uVar3 = 4;
          }
          if ((mr->ops->impl).unaligned == false) {
            uVar4 = -(uint)addr & (uint)addr;
            uVar5 = uVar4;
            if (uVar3 < uVar4) {
              uVar5 = uVar3;
            }
            if (uVar4 != 0) {
              uVar3 = uVar5;
            }
          }
          if (uVar3 < (uint)local_48) {
            local_48._0_4_ = uVar3;
          }
          lVar1 = 0x3f;
          if ((uint)local_48 != 0) {
            for (; (uint)local_48 >> lVar1 == 0; lVar1 = lVar1 + -1) {
            }
          }
          uVar3 = (uint)(0x8000000000000000 >> (~(byte)lVar1 & 0x3f));
          if ((uint)local_48 == 0) {
            uVar3 = 0;
          }
          local_48 = (hwaddr)(int)uVar3;
          uc = local_40;
          _Var2 = memory_region_access_valid_tricore(local_40,mr,local_38,uVar3,is_write,attrs);
          if (!_Var2) {
            return false;
          }
        }
      }
      else if ((!is_write & mr->ram) == 0) goto LAB_00ce97ff;
      addr = addr + local_48;
      len = len - local_48;
    } while (len != 0);
  }
  return true;
}

Assistant:

static bool flatview_access_valid(struct uc_struct *uc, FlatView *fv, hwaddr addr, hwaddr len,
                                  bool is_write, MemTxAttrs attrs)
{
    MemoryRegion *mr;
    hwaddr l, xlat;

    while (len > 0) {
        l = len;
        mr = flatview_translate(uc, fv, addr, &xlat, &l, is_write, attrs);
        if (!memory_access_is_direct(mr, is_write)) {
            l = memory_access_size(mr, l, addr);
            if (!memory_region_access_valid(uc, mr, xlat, l, is_write, attrs)) {
                return false;
            }
        }

        len -= l;
        addr += l;
    }
    return true;
}